

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerators::WriteOldMocDefinitionsFile(cmQtAutoGenerators *this,string *targetDirectory)

{
  ostream *poVar1;
  string filename;
  string local_230;
  ofstream outfile;
  
  cmsys::SystemTools::CollapseFullPath(&filename,targetDirectory);
  cmsys::SystemTools::ConvertToUnixSlashes(&filename);
  std::__cxx11::string::append((char *)&filename);
  std::ofstream::ofstream(&outfile);
  std::ofstream::open((char *)&outfile,(_Ios_Openmode)filename._M_dataplus._M_p);
  poVar1 = std::operator<<(&outfile.super_basic_ostream<char,_std::char_traits<char>_>,
                           "set(AM_OLD_COMPILE_SETTINGS ");
  cmOutputConverter::EscapeForCMake(&local_230,&this->CurrentCompileSettingsStr);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&local_230);
  std::ofstream::close();
  std::ofstream::~ofstream(&outfile);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void
cmQtAutoGenerators::WriteOldMocDefinitionsFile(
                                            const std::string& targetDirectory)
{
  std::string filename(
      cmSystemTools::CollapseFullPath(targetDirectory));
  cmSystemTools::ConvertToUnixSlashes(filename);
  filename += "/AutomocOldMocDefinitions.cmake";

  cmsys::ofstream outfile;
  outfile.open(filename.c_str(),
               std::ios::trunc);
  outfile << "set(AM_OLD_COMPILE_SETTINGS "
              << cmOutputConverter::EscapeForCMake(
                 this->CurrentCompileSettingsStr) << ")\n";

  outfile.close();
}